

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quant_enc.c
# Opt level: O0

int VP8Decimate(VP8EncIterator *it,VP8ModeScore *rd,VP8RDLevel rd_opt)

{
  int iVar1;
  uint skip;
  uint in_EDX;
  VP8EncIterator *in_RSI;
  VP8EncIterator *in_RDI;
  VP8EncIterator *unaff_retaddr;
  int method;
  int is_skipped;
  VP8ModeScore *in_stack_000000b0;
  int in_stack_000000b8;
  int in_stack_000000bc;
  VP8EncIterator *in_stack_000000c0;
  VP8ModeScore *in_stack_00000388;
  VP8EncIterator *in_stack_00000390;
  VP8ModeScore *in_stack_000006f8;
  VP8EncIterator *in_stack_00000700;
  VP8ModeScore *in_stack_00000ab0;
  VP8EncIterator *in_stack_00000ab8;
  
  iVar1 = in_RDI->enc_->method_;
  InitScore((VP8ModeScore *)in_RSI);
  VP8MakeLuma16Preds(in_RSI);
  VP8MakeChroma8Preds(in_RSI);
  if (in_EDX == 0) {
    RefineUsingDistortion(in_stack_000000c0,in_stack_000000bc,in_stack_000000b8,in_stack_000000b0);
  }
  else {
    in_RDI->do_trellis_ = (uint)(2 < in_EDX);
    PickBestIntra16(in_stack_00000390,in_stack_00000388);
    if (1 < iVar1) {
      PickBestIntra4(in_stack_00000ab8,in_stack_00000ab0);
    }
    PickBestUV(in_stack_00000700,in_stack_000006f8);
    if (in_EDX == 2) {
      in_RDI->do_trellis_ = 1;
      SimpleQuantize(unaff_retaddr,(VP8ModeScore *)in_RDI);
    }
  }
  skip = (uint)(*(int *)(in_RSI->yuv_mem_ + 0x178) == 0);
  VP8SetSkip(in_RDI,skip);
  return skip;
}

Assistant:

int VP8Decimate(VP8EncIterator* WEBP_RESTRICT const it,
                VP8ModeScore* WEBP_RESTRICT const rd,
                VP8RDLevel rd_opt) {
  int is_skipped;
  const int method = it->enc_->method_;

  InitScore(rd);

  // We can perform predictions for Luma16x16 and Chroma8x8 already.
  // Luma4x4 predictions needs to be done as-we-go.
  VP8MakeLuma16Preds(it);
  VP8MakeChroma8Preds(it);

  if (rd_opt > RD_OPT_NONE) {
    it->do_trellis_ = (rd_opt >= RD_OPT_TRELLIS_ALL);
    PickBestIntra16(it, rd);
    if (method >= 2) {
      PickBestIntra4(it, rd);
    }
    PickBestUV(it, rd);
    if (rd_opt == RD_OPT_TRELLIS) {   // finish off with trellis-optim now
      it->do_trellis_ = 1;
      SimpleQuantize(it, rd);
    }
  } else {
    // At this point we have heuristically decided intra16 / intra4.
    // For method >= 2, pick the best intra4/intra16 based on SSE (~tad slower).
    // For method <= 1, we don't re-examine the decision but just go ahead with
    // quantization/reconstruction.
    RefineUsingDistortion(it, (method >= 2), (method >= 1), rd);
  }
  is_skipped = (rd->nz == 0);
  VP8SetSkip(it, is_skipped);
  return is_skipped;
}